

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::ArrayWrapper<Eigen::Matrix<float,3,1,0,3,1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,3,1,0,3,1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sign_op<float,false,false>,Eigen::ArrayWrapper<Eigen::Matrix<float,3,1,0,3,1>>const>const>,Eigen::internal::sub_assign_op<float,float>>
               (ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sign_op<float,_false,_false>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
               *src,sub_assign_op<float,_float> *func)

{
  ActualDstType actualDst;
  sub_assign_op<float,_float> *func_local;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sign_op<float,_false,_false>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
  *src_local;
  ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *dst_local;
  
  Assignment<Eigen::ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sign_op<float,_false,_false>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::sub_assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}